

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

Output * grib2dec_demo::Output::create(string *filename,string *format)

{
  int iVar1;
  Svg *this;
  
  if (format->_M_string_length == 0 && filename->_M_string_length == 0) {
    this = (Svg *)operator_new(0x210);
    (this->super_Output)._vptr_Output = (_func_int **)&PTR___cxa_pure_virtual_00105c80;
    (this->super_Output).out = (ostream *)&std::cout;
    std::ofstream::ofstream(&(this->super_Output).fileOut);
    (this->super_Output)._vptr_Output = (_func_int **)&PTR_setComponent_00105cc0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)format);
    if (iVar1 == 0) {
      this = (Svg *)operator_new(0x280);
      Svg::Svg(this,filename);
    }
    else {
      this = (Svg *)operator_new(0x210);
      Txt::Txt((Txt *)this,filename);
    }
  }
  return &this->super_Output;
}

Assistant:

Output *Output::create(const std::string& filename, const std::string& format)
{
    if (filename.empty() && format.empty())
        return new NullOutput();
    else if (format == "svg")
        return new Svg(filename);
    else
        // txt by default
        return new Txt(filename);
}